

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressContinue
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  U32 UVar2;
  U32 UVar3;
  ZSTD_DCtx *dctx_00;
  ulong srcSize_00;
  XXH64_hash_t XVar4;
  ZSTD_dStage ZVar5;
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  ZSTD_DCtx *in_RDI;
  size_t in_R8;
  U32 check32;
  U32 h32;
  size_t rSize;
  size_t cBlockSize;
  blockProperties_t bp;
  size_t errcod;
  size_t in_stack_00000110;
  void *in_stack_00000118;
  XXH64_state_t *in_stack_00000120;
  blockProperties_t *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  void *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  blockType_e in_stack_ffffffffffffffbc;
  int local_40;
  uint local_3c;
  ZSTD_DCtx *in_stack_fffffffffffffff8;
  size_t sVar6;
  
  if (in_R8 == in_RDI->expected) {
    if (in_RDX != (void *)0x0) {
      ZSTD_checkContinuity(in_RDI,in_RSI);
    }
    dctx_00 = (ZSTD_DCtx *)(ulong)in_RDI->stage;
    switch(dctx_00) {
    case (ZSTD_DCtx *)0x0:
      if ((in_RDI->format == ZSTD_f_zstd1) &&
         (UVar3 = MEM_readLE32(in_stack_ffffffffffffff88), (UVar3 & 0xfffffff0) == 0x184d2a50)) {
        memcpy(in_RDI->headerBuffer,in_RCX,in_R8);
        in_RDI->expected = 8 - in_R8;
        in_RDI->stage = ZSTDds_decodeSkippableHeader;
        sVar6 = 0;
      }
      else {
        sVar6 = ZSTD_frameHeaderSize_internal
                          ((void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           in_stack_ffffffffffffffb0,
                           (ZSTD_format_e)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
        in_RDI->headerSize = sVar6;
        uVar1 = ERR_isError(in_RDI->headerSize);
        if (uVar1 == 0) {
          memcpy(in_RDI->headerBuffer,in_RCX,in_R8);
          in_RDI->expected = in_RDI->headerSize - in_R8;
          in_RDI->stage = ZSTDds_decodeFrameHeader;
          sVar6 = 0;
        }
        else {
          sVar6 = in_RDI->headerSize;
        }
      }
      break;
    case (ZSTD_DCtx *)0x1:
      memcpy((void *)((long)in_RDI + (in_RDI->headerSize - in_R8) + 0x271d4),in_RCX,in_R8);
      sVar6 = ZSTD_decodeFrameHeader
                        (dctx_00,in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
      uVar1 = ERR_isError(sVar6);
      if (uVar1 == 0) {
        in_RDI->expected = 3;
        in_RDI->stage = ZSTDds_decodeBlockHeader;
        sVar6 = 0;
      }
      break;
    case (ZSTD_DCtx *)0x2:
      sVar6 = ZSTD_getcBlockSize(dctx_00,(size_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                                );
      uVar1 = ERR_isError(sVar6);
      if (uVar1 == 0) {
        in_RDI->expected = sVar6;
        in_RDI->bType = in_stack_ffffffffffffffbc;
        in_RDI->rleSize = (ulong)local_3c;
        if (sVar6 == 0) {
          if (local_40 == 0) {
            in_RDI->expected = 3;
            in_RDI->stage = ZSTDds_decodeBlockHeader;
          }
          else if ((in_RDI->fParams).checksumFlag == 0) {
            in_RDI->expected = 0;
            in_RDI->stage = ZSTDds_getFrameHeaderSize;
          }
          else {
            in_RDI->expected = 4;
            in_RDI->stage = ZSTDds_checkChecksum;
          }
          sVar6 = 0;
        }
        else {
          ZVar5 = ZSTDds_decompressBlock;
          if (local_40 != 0) {
            ZVar5 = ZSTDds_decompressLastBlock;
          }
          in_RDI->stage = ZVar5;
          sVar6 = 0;
        }
      }
      break;
    case (ZSTD_DCtx *)0x3:
    case (ZSTD_DCtx *)0x4:
      srcSize_00 = (ulong)in_RDI->bType;
      switch(srcSize_00) {
      case 0:
        sVar6 = ZSTD_copyRawBlock(dctx_00,srcSize_00,in_stack_ffffffffffffff88,0x200a46);
        break;
      case 1:
        sVar6 = ZSTD_setRleBlock(in_stack_ffffffffffffffa8,
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                 dctx_00,srcSize_00,(size_t)in_stack_ffffffffffffff88);
        break;
      case 2:
        sVar6 = ZSTD_decompressBlock_internal
                          (in_stack_fffffffffffffff8,in_RDI,(size_t)in_RSI,in_RDX,(size_t)in_RCX,
                           (int)(in_R8 >> 0x20));
        break;
      case 3:
      default:
        return 0xffffffffffffffec;
      }
      uVar1 = ERR_isError(sVar6);
      if (uVar1 == 0) {
        in_RDI->decodedSize = sVar6 + in_RDI->decodedSize;
        if ((in_RDI->fParams).checksumFlag != 0) {
          XXH64_update(in_stack_00000120,in_stack_00000118,in_stack_00000110);
        }
        if (in_RDI->stage == ZSTDds_decompressLastBlock) {
          if (((in_RDI->fParams).frameContentSize == 0xffffffffffffffff) ||
             (in_RDI->decodedSize == (in_RDI->fParams).frameContentSize)) {
            if ((in_RDI->fParams).checksumFlag == 0) {
              in_RDI->expected = 0;
              in_RDI->stage = ZSTDds_getFrameHeaderSize;
            }
            else {
              in_RDI->expected = 4;
              in_RDI->stage = ZSTDds_checkChecksum;
            }
          }
          else {
            sVar6 = 0xffffffffffffffec;
          }
        }
        else {
          in_RDI->stage = ZSTDds_decodeBlockHeader;
          in_RDI->expected = 3;
          in_RDI->previousDstEnd = (void *)((long)in_RSI + sVar6);
        }
      }
      break;
    case (ZSTD_DCtx *)0x5:
      XVar4 = XXH64_digest((XXH64_state_t *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      UVar3 = (U32)XVar4;
      UVar2 = MEM_readLE32(in_stack_ffffffffffffff88);
      if (UVar2 == UVar3) {
        in_RDI->expected = 0;
        in_RDI->stage = ZSTDds_getFrameHeaderSize;
        sVar6 = 0;
      }
      else {
        sVar6 = 0xffffffffffffffea;
      }
      break;
    case (ZSTD_DCtx *)0x6:
      memcpy((void *)((long)in_RDI + (0x271dc - in_R8)),in_RCX,in_R8);
      UVar3 = MEM_readLE32(in_stack_ffffffffffffff88);
      in_RDI->expected = (ulong)UVar3;
      in_RDI->stage = ZSTDds_skipFrame;
      sVar6 = 0;
      break;
    case (ZSTD_DCtx *)0x7:
      in_RDI->expected = 0;
      in_RDI->stage = ZSTDds_getFrameHeaderSize;
      sVar6 = 0;
      break;
    default:
      sVar6 = 0xffffffffffffffff;
    }
  }
  else {
    sVar6 = 0xffffffffffffffb8;
  }
  return sVar6;
}

Assistant:

size_t ZSTD_decompressContinue(ZSTD_DCtx* dctx, void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    DEBUGLOG(5, "ZSTD_decompressContinue (srcSize:%u)", (U32)srcSize);
    /* Sanity check */
    if (srcSize != dctx->expected) return ERROR(srcSize_wrong);  /* not allowed */
    if (dstCapacity) ZSTD_checkContinuity(dctx, dst);

    switch (dctx->stage)
    {
    case ZSTDds_getFrameHeaderSize :
        assert(src != NULL);
        if (dctx->format == ZSTD_f_zstd1) {  /* allows header */
            assert(srcSize >= ZSTD_frameIdSize);  /* to read skippable magic number */
            if ((MEM_readLE32(src) & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) {        /* skippable frame */
                memcpy(dctx->headerBuffer, src, srcSize);
                dctx->expected = ZSTD_skippableHeaderSize - srcSize;  /* remaining to load to get full skippable frame header */
                dctx->stage = ZSTDds_decodeSkippableHeader;
                return 0;
        }   }
        dctx->headerSize = ZSTD_frameHeaderSize_internal(src, srcSize, dctx->format);
        if (ZSTD_isError(dctx->headerSize)) return dctx->headerSize;
        memcpy(dctx->headerBuffer, src, srcSize);
        dctx->expected = dctx->headerSize - srcSize;
        dctx->stage = ZSTDds_decodeFrameHeader;
        return 0;

    case ZSTDds_decodeFrameHeader:
        assert(src != NULL);
        memcpy(dctx->headerBuffer + (dctx->headerSize - srcSize), src, srcSize);
        CHECK_F(ZSTD_decodeFrameHeader(dctx, dctx->headerBuffer, dctx->headerSize));
        dctx->expected = ZSTD_blockHeaderSize;
        dctx->stage = ZSTDds_decodeBlockHeader;
        return 0;

    case ZSTDds_decodeBlockHeader:
        {   blockProperties_t bp;
            size_t const cBlockSize = ZSTD_getcBlockSize(src, ZSTD_blockHeaderSize, &bp);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;
            dctx->expected = cBlockSize;
            dctx->bType = bp.blockType;
            dctx->rleSize = bp.origSize;
            if (cBlockSize) {
                dctx->stage = bp.lastBlock ? ZSTDds_decompressLastBlock : ZSTDds_decompressBlock;
                return 0;
            }
            /* empty block */
            if (bp.lastBlock) {
                if (dctx->fParams.checksumFlag) {
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    dctx->expected = 0; /* end of frame */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->expected = ZSTD_blockHeaderSize;  /* jump to next header */
                dctx->stage = ZSTDds_decodeBlockHeader;
            }
            return 0;
        }

    case ZSTDds_decompressLastBlock:
    case ZSTDds_decompressBlock:
        DEBUGLOG(5, "ZSTD_decompressContinue: case ZSTDds_decompressBlock");
        {   size_t rSize;
            switch(dctx->bType)
            {
            case bt_compressed:
                DEBUGLOG(5, "ZSTD_decompressContinue: case bt_compressed");
                rSize = ZSTD_decompressBlock_internal(dctx, dst, dstCapacity, src, srcSize, /* frame */ 1);
                break;
            case bt_raw :
                rSize = ZSTD_copyRawBlock(dst, dstCapacity, src, srcSize);
                break;
            case bt_rle :
                rSize = ZSTD_setRleBlock(dst, dstCapacity, src, srcSize, dctx->rleSize);
                break;
            case bt_reserved :   /* should never happen */
            default:
                return ERROR(corruption_detected);
            }
            if (ZSTD_isError(rSize)) return rSize;
            DEBUGLOG(5, "ZSTD_decompressContinue: decoded size from block : %u", (U32)rSize);
            dctx->decodedSize += rSize;
            if (dctx->fParams.checksumFlag) XXH64_update(&dctx->xxhState, dst, rSize);

            if (dctx->stage == ZSTDds_decompressLastBlock) {   /* end of frame */
                DEBUGLOG(4, "ZSTD_decompressContinue: decoded size from frame : %u", (U32)dctx->decodedSize);
                if (dctx->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN) {
                    if (dctx->decodedSize != dctx->fParams.frameContentSize) {
                        return ERROR(corruption_detected);
                }   }
                if (dctx->fParams.checksumFlag) {  /* another round for frame checksum */
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    dctx->expected = 0;   /* ends here */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->stage = ZSTDds_decodeBlockHeader;
                dctx->expected = ZSTD_blockHeaderSize;
                dctx->previousDstEnd = (char*)dst + rSize;
            }
            return rSize;
        }

    case ZSTDds_checkChecksum:
        assert(srcSize == 4);  /* guaranteed by dctx->expected */
        {   U32 const h32 = (U32)XXH64_digest(&dctx->xxhState);
            U32 const check32 = MEM_readLE32(src);
            DEBUGLOG(4, "ZSTD_decompressContinue: checksum : calculated %08X :: %08X read", h32, check32);
            if (check32 != h32) return ERROR(checksum_wrong);
            dctx->expected = 0;
            dctx->stage = ZSTDds_getFrameHeaderSize;
            return 0;
        }

    case ZSTDds_decodeSkippableHeader:
        assert(src != NULL);
        assert(srcSize <= ZSTD_skippableHeaderSize);
        memcpy(dctx->headerBuffer + (ZSTD_skippableHeaderSize - srcSize), src, srcSize);   /* complete skippable header */
        dctx->expected = MEM_readLE32(dctx->headerBuffer + ZSTD_frameIdSize);   /* note : dctx->expected can grow seriously large, beyond local buffer size */
        dctx->stage = ZSTDds_skipFrame;
        return 0;

    case ZSTDds_skipFrame:
        dctx->expected = 0;
        dctx->stage = ZSTDds_getFrameHeaderSize;
        return 0;

    default:
        return ERROR(GENERIC);   /* impossible */
    }
}